

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

int get_byte(MIR_context_t ctx)

{
  void *pvVar1;
  uint uVar2;
  size_t sVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t h;
  uint uVar6;
  int iVar7;
  uint8_t *key;
  uint uVar8;
  reduce_data *prVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  uint8_t tag;
  uint8_t u;
  uint8_t u_1;
  uint8_t u_2;
  uint8_t u_3;
  uint8_t u_4;
  uint8_t u_5;
  byte local_67;
  byte local_66;
  byte local_65;
  byte local_64;
  byte local_63;
  byte local_62;
  byte local_61;
  reduce_reader_t local_60;
  uint8_t *local_58;
  MIR_context_t local_50;
  void *local_48;
  reduce_data *local_40;
  byte local_38 [8];
  
  prVar9 = ctx->io_ctx->io_reduce_data;
  uVar8 = (prVar9->u).decode.buf_get_pos;
  if (uVar8 < prVar9->buf_bound) {
    (prVar9->u).decode.buf_get_pos = uVar8 + 1;
    uVar8 = (uint)prVar9->buf[uVar8];
  }
  else {
    uVar8 = 0xffffffff;
    if ((prVar9->u).decode.eof_p == '\0') {
      local_60 = (prVar9->u).decode.reader;
      key = prVar9->buf;
      uVar8 = 0;
      uVar5 = 0;
      local_58 = key;
      local_50 = ctx;
      local_40 = prVar9;
      do {
        sVar3 = (*local_60)(&local_67,1,prVar9->aux_data);
        if (sVar3 == 0) {
LAB_00144c8e:
          prVar9->ok_p = '\0';
LAB_00144c96:
          uVar8 = 0xffffffff;
          ctx = local_50;
          goto LAB_00144ca0;
        }
        if (local_67 == 0) {
          pbVar13 = local_38;
          sVar3 = (*local_60)(pbVar13,8,prVar9->aux_data);
          if ((sVar3 == 8) && (sVar3 = (*local_60)(&local_67,1,prVar9->aux_data), sVar3 == 0)) {
            if (uVar8 != 0) {
              uVar4 = mir_hash_strict(key,(ulong)uVar8,prVar9->check_hash);
              prVar9->check_hash = uVar4;
            }
            uVar5 = 0;
            uVar11 = 0;
            do {
              uVar11 = uVar11 | (ulong)*pbVar13 << (uVar5 & 0x3f);
              uVar5 = uVar5 + 8;
              pbVar13 = pbVar13 + 1;
            } while (uVar5 != 0x40);
            if (uVar11 == prVar9->check_hash) {
              (prVar9->u).decode.eof_p = '\x01';
              (prVar9->u).decode.buf_get_pos = 0;
              prVar9->buf_bound = uVar8;
              if (uVar8 == 0) goto LAB_00144c96;
              goto LAB_00144bde;
            }
          }
          goto LAB_00144c8e;
        }
        if (0x1f < local_67) {
          uVar11 = (ulong)(uint)(local_67 >> 5);
          if (local_67 >> 5 == 7) {
            local_48 = prVar9->aux_data;
            sVar3 = (*local_60)(&local_66,1,local_48);
            uVar11 = 0xffffffffffffffff;
            if (sVar3 == 1) {
              uVar6 = 1;
              uVar2 = 7;
              do {
                if (local_66 >> (uVar2 & 0x1f) == 1) goto LAB_00144914;
                uVar6 = uVar6 + 1;
                uVar2 = uVar2 - 1;
              } while (uVar6 != 5);
              uVar6 = 5;
LAB_00144914:
              if (local_66 >> ((byte)(8 - (char)uVar6) & 0x1f) != 1) goto LAB_00144cc5;
              uVar2 = 0xffU >> (uVar6 & 0x1f) & (uint)local_66;
              if (1 < uVar6) {
                iVar7 = uVar6 - 1;
                do {
                  sVar3 = (*local_60)(&local_65,1,local_48);
                  key = local_58;
                  if (sVar3 != 1) goto LAB_00144968;
                  uVar2 = uVar2 << 8 | (uint)local_65;
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
              }
              uVar11 = (ulong)uVar2;
              key = local_58;
            }
LAB_00144968:
            if ((long)uVar11 < 0) goto LAB_00144c8e;
          }
          uVar2 = (uint)uVar11;
          if (((0x7ff < uVar2) || (0x40000 < uVar2 + uVar8)) ||
             (sVar3 = (*local_60)(key + uVar8,uVar11 & 0xffffffff,prVar9->aux_data),
             sVar3 != (uVar11 & 0xffffffff))) goto LAB_00144c8e;
          while (uVar2 != 0) {
            *(uint *)((long)&prVar9->u + uVar5 * 4 + 0x10) = uVar8;
            uVar8 = uVar8 + 1;
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar2 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar2;
          }
        }
        uVar12 = (ulong)(local_67 & 0x1f);
        uVar11 = uVar5;
        if ((local_67 & 0x1f) == 0) goto LAB_00144ba5;
        if ((char)(local_67 & 0x1f) == '\x1f') {
          local_48 = prVar9->aux_data;
          sVar3 = (*local_60)(&local_64,1,local_48);
          uVar12 = 0xffffffffffffffff;
          if (sVar3 == 1) {
            uVar6 = 1;
            uVar2 = 7;
            do {
              if (local_64 >> (uVar2 & 0x1f) == 1) goto LAB_00144a35;
              uVar6 = uVar6 + 1;
              uVar2 = uVar2 - 1;
            } while (uVar6 != 5);
            uVar6 = 5;
LAB_00144a35:
            if (local_64 >> ((byte)(8 - (char)uVar6) & 0x1f) != 1) goto LAB_00144cc5;
            uVar2 = 0xffU >> (uVar6 & 0x1f) & (uint)local_64;
            if (1 < uVar6) {
              iVar7 = uVar6 - 1;
              do {
                sVar3 = (*local_60)(&local_63,1,local_48);
                key = local_58;
                if (sVar3 != 1) goto LAB_00144a89;
                uVar2 = uVar2 << 8 | (uint)local_63;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            uVar12 = (ulong)uVar2;
            key = local_58;
          }
LAB_00144a89:
          if ((long)uVar12 < 0) goto LAB_00144c8e;
        }
        pvVar1 = prVar9->aux_data;
        sVar3 = (*local_60)(&local_62,1,pvVar1);
        uVar11 = 0xffffffffffffffff;
        if (sVar3 == 1) {
          uVar6 = 1;
          uVar2 = 7;
          do {
            if (local_62 >> (uVar2 & 0x1f) == 1) goto LAB_00144aea;
            uVar6 = uVar6 + 1;
            uVar2 = uVar2 - 1;
          } while (uVar6 != 5);
          uVar6 = 5;
LAB_00144aea:
          if (local_62 >> ((byte)(8 - (char)uVar6) & 0x1f) != 1) goto LAB_00144cc5;
          uVar2 = 0xffU >> (uVar6 & 0x1f) & (uint)local_62;
          if (1 < uVar6) {
            iVar7 = uVar6 - 1;
            do {
              sVar3 = (*local_60)(&local_61,1,pvVar1);
              if (sVar3 != 1) {
                uVar11 = 0xffffffffffffffff;
                key = local_58;
                prVar9 = local_40;
                goto LAB_00144b57;
              }
              uVar2 = uVar2 << 8 | (uint)local_61;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          uVar11 = (ulong)uVar2;
          key = local_58;
          prVar9 = local_40;
        }
LAB_00144b57:
        if ((long)uVar11 < 0) goto LAB_00144c8e;
        uVar2 = (uint)uVar5;
        if (uVar2 < (uint)uVar11) goto LAB_00144c8e;
        uVar10 = (int)uVar12 + 3;
        uVar6 = *(uint *)((long)&prVar9->u + (ulong)(uVar2 - (uint)uVar11) * 4 + 0x10);
        if (0x40000 < uVar6 + uVar10) goto LAB_00144c8e;
        memcpy(key + uVar8,key + uVar6,(ulong)uVar10);
        uVar11 = (ulong)(uVar2 + 1);
        *(uint *)((long)&prVar9->u + uVar5 * 4 + 0x10) = uVar8;
        uVar8 = uVar10 + uVar8;
LAB_00144ba5:
        uVar5 = uVar11;
      } while (uVar8 < 0x40000);
      if (uVar8 != 0x40000) {
        __assert_fail("pos == _REDUCE_BUF_LEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-reduce.h"
                      ,0x19d,"int reduce_decode_get(struct reduce_data *)");
      }
      uVar4 = mir_hash_strict(key,0x40000,prVar9->check_hash);
      prVar9->check_hash = uVar4;
      prVar9->buf_bound = 0x40000;
LAB_00144bde:
      (prVar9->u).decode.buf_get_pos = 1;
      uVar8 = (uint)prVar9->buf[0];
      ctx = local_50;
    }
  }
LAB_00144ca0:
  if (uVar8 != 0xffffffff) {
    return uVar8;
  }
  (*ctx->error_func)(MIR_binary_io_error,"unfinished binary MIR");
LAB_00144cc5:
  __assert_fail("(u >> (8 - n)) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-reduce.h"
                ,0x89,"int64_t _reduce_uint_read(reduce_reader_t, void *)");
}

Assistant:

static int get_byte (MIR_context_t ctx) {
#ifdef MIR_NO_BIN_COMPRESSION
  int c = io_reader (ctx);
#else
  int c = reduce_decode_get (io_reduce_data);
#endif

  if (c == EOF) MIR_get_error_func (ctx) (MIR_binary_io_error, "unfinished binary MIR");
  return c;
}